

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_parse_change_cipher_spec(mbedtls_ssl_context *ssl)

{
  uint16_t uVar1;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x11b1,"=> parse change cipher spec");
  ssl_local._4_4_ = mbedtls_ssl_read_record(ssl);
  if (ssl_local._4_4_ == 0) {
    if (ssl->in_msgtype == 0x14) {
      if ((ssl->in_msglen == 1) && (*ssl->in_msg == '\x01')) {
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0x11c9,"switching to new transform spec for inbound data");
        ssl->transform_in = ssl->transform_negotiate;
        ssl->session_in = ssl->session_negotiate;
        if ((*(uint *)&ssl->conf->field_0x174 >> 1 & 1) == 1) {
          ssl_dtls_replay_reset(ssl);
          uVar1 = ssl->in_epoch + 1;
          ssl->in_epoch = uVar1;
          if (uVar1 == 0) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0x11d7,"DTLS epoch would wrap");
            return -0x6b80;
          }
        }
        else {
          memset(ssl->in_ctr,0,8);
        }
        if (ssl->minor_ver < 2) {
          ssl->in_msg = ssl->in_iv;
        }
        else {
          ssl->in_msg = ssl->in_iv +
                        (ssl->transform_negotiate->ivlen - ssl->transform_negotiate->fixed_ivlen);
        }
        ssl->state = ssl->state + 1;
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0x11f7,"<= parse change cipher spec");
        ssl_local._4_4_ = 0;
      }
      else {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0x11c1,"bad change cipher spec message");
        ssl_local._4_4_ = -0x7e00;
      }
    }
    else {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x11bb,"bad change cipher spec message");
      ssl_local._4_4_ = -0x7700;
    }
  }
  else {
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x11b5,"mbedtls_ssl_read_record",ssl_local._4_4_);
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_parse_change_cipher_spec( mbedtls_ssl_context *ssl )
{
    int ret;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse change cipher spec" ) );

    if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
        return( ret );
    }

    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_CHANGE_CIPHER_SPEC )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad change cipher spec message" ) );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

    if( ssl->in_msglen != 1 || ssl->in_msg[0] != 1 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad change cipher spec message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CHANGE_CIPHER_SPEC );
    }

    /*
     * Switch to our negotiated transform and session parameters for inbound
     * data.
     */
    MBEDTLS_SSL_DEBUG_MSG( 3, ( "switching to new transform spec for inbound data" ) );
    ssl->transform_in = ssl->transform_negotiate;
    ssl->session_in = ssl->session_negotiate;

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
#if defined(MBEDTLS_SSL_DTLS_ANTI_REPLAY)
        ssl_dtls_replay_reset( ssl );
#endif

        /* Increment epoch */
        if( ++ssl->in_epoch == 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "DTLS epoch would wrap" ) );
            return( MBEDTLS_ERR_SSL_COUNTER_WRAPPING );
        }
    }
    else
#endif /* MBEDTLS_SSL_PROTO_DTLS */
    memset( ssl->in_ctr, 0, 8 );

    /*
     * Set the in_msg pointer to the correct location based on IV length
     */
    if( ssl->minor_ver >= MBEDTLS_SSL_MINOR_VERSION_2 )
    {
        ssl->in_msg = ssl->in_iv + ssl->transform_negotiate->ivlen -
                      ssl->transform_negotiate->fixed_ivlen;
    }
    else
        ssl->in_msg = ssl->in_iv;

#if defined(MBEDTLS_SSL_HW_RECORD_ACCEL)
    if( mbedtls_ssl_hw_record_activate != NULL )
    {
        if( ( ret = mbedtls_ssl_hw_record_activate( ssl, MBEDTLS_SSL_CHANNEL_INBOUND ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_hw_record_activate", ret );
            return( MBEDTLS_ERR_SSL_HW_ACCEL_FAILED );
        }
    }
#endif

    ssl->state++;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse change cipher spec" ) );

    return( 0 );
}